

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O2

void rx__log(rx_log_level level,char *file,int line,char *fmt,...)

{
  int iVar1;
  char in_AL;
  int iVar2;
  char *pcVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *level_style_begin;
  va_list args;
  char *local_100;
  undefined8 local_f8;
  char **local_f0;
  undefined1 *local_e8;
  undefined1 local_d8 [32];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (fmt != (char *)0x0) {
    iVar1 = *(int *)("failed to set-up the fixture" + (long)(int)level * 4 + 0x12);
    iVar2 = fileno(_stderr);
    iVar2 = isatty(iVar2);
    if (iVar2 == 0) {
      pcVar3 = "";
      local_100 = "";
    }
    else {
      rx__log_style_get_ansi_code
                (&local_100,*(rx__log_style *)(&DAT_00104034 + (long)(int)level * 4));
      pcVar3 = "\x1b[0m";
    }
    local_e8 = local_d8;
    local_f0 = &level_style_begin;
    local_f8 = 0x3000000020;
    fprintf(_stderr,"%s:%d: %s%s%s: ",
            "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
            ,(ulong)(uint)line,local_100,&DAT_00104d18 + iVar1,pcVar3);
    vfprintf(_stderr,fmt,&local_f8);
    return;
  }
  __assert_fail("fmt != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                ,0x1107,"void rx__log(enum rx_log_level, const char *, int, const char *, ...)");
}

Assistant:

static void
rx__log(enum rx_log_level level,
        const char *file,
        int line,
        const char *fmt,
        ...)
{
    const char *level_name;
    const char *level_style_begin;
    const char *level_style_end;
    va_list args;

    RX_ASSERT(file != NULL);
    RX_ASSERT(fmt != NULL);

    rx__log_level_get_name(&level_name, level);

#if RX__LOG_STYLING
    if (RX__ISATTY(RX__FILENO(stderr))) {
        enum rx__log_style level_style;

        rx__log_level_get_style(&level_style, level);
        rx__log_style_get_ansi_code(&level_style_begin, level_style);
        rx__log_style_get_ansi_code(&level_style_end, RX__LOG_STYLE_RESET);
    } else {
        level_style_begin = level_style_end = "";
    }
#else
    level_style_begin = level_style_end = "";
#endif

    va_start(args, fmt);
    fprintf(stderr,
            "%s:%d: %s%s%s: ",
            file,
            line,
            level_style_begin,
            level_name,
            level_style_end);
    vfprintf(stderr, fmt, args);
    va_end(args);
}